

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O1

MOJOSHADER_irExprList * build_ir_exprlist(Context_conflict *ctx,MOJOSHADER_astArguments *args)

{
  MOJOSHADER_irExpression *pMVar1;
  MOJOSHADER_irExprList *pMVar2;
  MOJOSHADER_irExprList *pMVar3;
  
  if (args == (MOJOSHADER_astArguments *)0x0) {
    pMVar2 = (MOJOSHADER_irExprList *)0x0;
  }
  else {
    pMVar3 = (MOJOSHADER_irExprList *)0x0;
    do {
      pMVar1 = (MOJOSHADER_irExpression *)build_ir(ctx,args->argument);
      if (pMVar1 != (MOJOSHADER_irExpression *)0x0) {
        if ((pMVar1->ir).type == MOJOSHADER_IR_START_RANGE_EXPR) {
          __assert_fail("!retval || (retval->ir.type > MOJOSHADER_IR_START_RANGE_EXPR)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                        ,0x11ec,"MOJOSHADER_irExpression *build_ir_expr(Context *, void *)");
        }
        if (MOJOSHADER_IR_CONSTRUCT < (pMVar1->ir).type) {
          __assert_fail("!retval || (retval->ir.type < MOJOSHADER_IR_END_RANGE_EXPR)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                        ,0x11ed,"MOJOSHADER_irExpression *build_ir_expr(Context *, void *)");
        }
      }
      pMVar2 = (MOJOSHADER_irExprList *)(*ctx->malloc)(0x28,ctx->malloc_data);
      if (pMVar2 == (MOJOSHADER_irExprList *)0x0) {
        ctx->isfail = 1;
        ctx->out_of_memory = 1;
        pMVar2 = (MOJOSHADER_irExprList *)0x0;
      }
      else {
        (pMVar2->ir).type = MOJOSHADER_IR_EXPRLIST;
        (pMVar2->ir).filename = ctx->sourcefile;
        (pMVar2->ir).line = ctx->sourceline;
        pMVar2->expr = pMVar1;
        pMVar2->next = (MOJOSHADER_irExprList *)0x0;
      }
      if (pMVar3 != (MOJOSHADER_irExprList *)0x0) {
        pMVar3->next = pMVar2;
        pMVar2 = pMVar3;
      }
      args = args->next;
      pMVar3 = pMVar2;
    } while (args != (MOJOSHADER_astArguments *)0x0);
  }
  return pMVar2;
}

Assistant:

static MOJOSHADER_irExprList *build_ir_exprlist(Context *ctx, MOJOSHADER_astArguments *args)
{
    MOJOSHADER_irExprList *retval = NULL;
    MOJOSHADER_irExprList *prev = NULL;

    while (args != NULL)
    {
        assert((retval && prev) || ((!retval) && (!prev)));

        MOJOSHADER_irExprList *item = new_ir_exprlist(ctx, build_ir_expr(ctx, args->argument));
        if (prev == NULL)
            prev = retval = item;
        else
            prev->next = item;

        args = args->next;
    } // while

    return retval;
}